

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStrMatParInterface.cpp
# Opt level: O0

TPZBaseMatrix * __thiscall
TPZStrMatParInterface::CreateAssemble
          (TPZStrMatParInterface *this,TPZBaseMatrix *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  bool bVar1;
  int64_t iVar2;
  TPZEquationFilter *this_00;
  TPZBaseMatrix *in_RSI;
  TPZStrMatParInterface *in_RDI;
  int64_t cols;
  TPZBaseMatrix *stiff;
  TPZStructMatrix *myself;
  TPZBaseMatrix *pTVar3;
  int64_t local_68;
  TPZStructMatrix *local_60;
  undefined1 local_38 [8];
  int64_t local_30;
  TPZBaseMatrix *local_28;
  TPZStructMatrix *local_20;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*(long *)in_RDI + 0x58))();
  if (in_RDI == (TPZStrMatParInterface *)0x0) {
    local_60 = (TPZStructMatrix *)0x0;
  }
  else {
    local_60 = (TPZStructMatrix *)
               __dynamic_cast(in_RDI,&typeinfo,&::TPZStructMatrix::typeinfo,0xffffffffffffffff);
  }
  local_20 = local_60;
  local_28 = (TPZBaseMatrix *)(**(code **)(*(long *)local_60 + 0x50))();
  iVar2 = TPZBaseMatrix::Cols(local_10);
  if (iVar2 < 1) {
    local_68 = 1;
  }
  else {
    local_68 = TPZBaseMatrix::Cols(local_10);
  }
  local_30 = local_68;
  bVar1 = ComputeRhs(in_RDI);
  pTVar3 = local_10;
  if (bVar1) {
    this_00 = ::TPZStructMatrix::EquationFilter(local_20);
    iVar2 = TPZEquationFilter::NEqExpand(this_00);
    (*(pTVar3->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar3,iVar2,local_30);
  }
  pTVar3 = local_28;
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)local_10,(TPZAutoPointer<TPZGuiInterface> *)local_28
            );
  (**(code **)(*(long *)in_RDI + 0x48))(in_RDI,pTVar3,local_10,local_38);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)local_10);
  (**(code **)(*(long *)in_RDI + 0x60))(in_RDI,local_28);
  return local_28;
}

Assistant:

TPZBaseMatrix *TPZStrMatParInterface::CreateAssemble(
    TPZBaseMatrix &rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    this->InitCreateAssemble();

    TPZStructMatrix *myself = dynamic_cast<TPZStructMatrix*>(this);
    TPZBaseMatrix *stiff = myself->Create();
    
    const int64_t cols = MAX(1, rhs.Cols());
    if(ComputeRhs()) rhs.Redim(myself->EquationFilter().NEqExpand(), cols);
    Assemble(*stiff, rhs, guiInterface);
    this->EndCreateAssemble(stiff);
#ifdef PZ_LOG2
    if (loggerel.isDebugEnabled()) {
        std::stringstream sout;
        stiff->Print("Stiffness matrix", sout);
        rhs.Print("Right hand side", sout);
        LOGPZ_DEBUG(loggerel, sout.str())
    }
#endif
    return stiff;
}